

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O2

void __thiscall
QHeaderViewPrivate::setHiddenSectionsFromBitVector
          (QHeaderViewPrivate *this,QBitArray *sectionHidden)

{
  char *pcVar1;
  pointer pSVar2;
  int i;
  ulong uVar3;
  char *pcVar4;
  
  pSVar2 = QList<QHeaderViewPrivate::SectionItem>::data(&this->sectionItems);
  uVar3 = 0;
  while( true ) {
    pcVar1 = (sectionHidden->d).d.ptr;
    pcVar4 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    if ((sectionHidden->d).d.size * 8 - (long)*pcVar4 <= (long)uVar3) break;
    *(uint *)(pSVar2 + uVar3) =
         *(uint *)(pSVar2 + uVar3) & 0xffefffff |
         (uint)(((byte)pcVar1[(uVar3 >> 3) + 1] >> ((uint)uVar3 & 7) & 1) != 0) << 0x14;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void setHiddenSectionsFromBitVector(const QBitArray &sectionHidden) {
        SectionItem *sectionData = sectionItems.data();
        for (int i = 0; i < sectionHidden.size(); ++i)
            sectionData[i].isHidden = sectionHidden.at(i);
    }